

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t archive_read_format_lha_cleanup(archive_read *a)

{
  void *__ptr;
  
  __ptr = a->format->data;
  if (*(long *)((long)__ptr + 0x1a0) != 0) {
    free(*(void **)(*(long *)((long)__ptr + 0x1a0) + 0x10));
    lzh_huffman_free((huffman_conflict *)(*(long *)((long)__ptr + 0x1a0) + 0x38));
    lzh_huffman_free((huffman_conflict *)(*(long *)((long)__ptr + 0x1a0) + 0xb8));
    free(*(void **)((long)__ptr + 0x1a0));
    *(undefined8 *)((long)__ptr + 0x1a0) = 0;
  }
  archive_string_free((archive_string *)((long)__ptr + 0xe0));
  archive_string_free((archive_string *)((long)__ptr + 0xf8));
  archive_string_free((archive_string *)((long)__ptr + 0x90));
  archive_string_free((archive_string *)((long)__ptr + 0xa8));
  archive_wstring_free((archive_wstring *)((long)__ptr + 0x110));
  free(__ptr);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int
archive_read_format_lha_cleanup(struct archive_read *a)
{
	struct lha *lha = (struct lha *)(a->format->data);

	lzh_decode_free(&(lha->strm));
	archive_string_free(&(lha->dirname));
	archive_string_free(&(lha->filename));
	archive_string_free(&(lha->uname));
	archive_string_free(&(lha->gname));
	archive_wstring_free(&(lha->ws));
	free(lha);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}